

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  byte *pbVar1;
  char cVar2;
  code *pcVar3;
  FILE *__stream;
  uint uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  size_t sVar8;
  char *pcVar9;
  int *piVar10;
  byte bVar11;
  byte bVar12;
  byte *pbVar13;
  char **ppcVar14;
  char *pcVar15;
  MbcType MVar16;
  char *fmt;
  MbcType MVar17;
  bool bVar18;
  bool bVar19;
  size_t sStack_e0;
  char *local_c8;
  char *endptr;
  uint local_a8;
  char *local_90;
  
  nbErrors = '\0';
LAB_00101305:
  uVar4 = musl_getopt_long_only(argc,argv,"Ccf:i:jk:l:m:n:Op:r:st:Vv",longopts,(int *)0x0);
  pcVar9 = musl_optarg;
  switch(uVar4) {
  case 0x56:
    pcVar9 = get_package_version_string();
    printf("rgbfix %s\n",pcVar9);
LAB_001023d2:
    exit(0);
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x61:
  case 0x62:
  case 100:
  case 0x65:
  case 0x67:
  case 0x68:
  case 0x6f:
  case 0x71:
  case 0x75:
switchD_0010132f_caseD_57:
    fprintf(_stderr,"FATAL: unknown option \'%c\'\n",(ulong)uVar4);
    goto LAB_00102398;
  case 99:
switchD_0010132f_caseD_63:
    model = (uVar4 != 99) + BOTH;
    if (0xf < titleLen) {
      titleLen = '\x0f';
      pcVar9 = "warning: Truncating title \"%s\" to 15 chars\n";
      goto LAB_00101653;
    }
    goto LAB_00101305;
  case 0x66:
    fixSpec = '\0';
    do {
      cVar2 = *musl_optarg;
      if (cVar2 == 'G') {
        if ((fixSpec & 8) != 0) {
          fwrite("warning: \'G\' overriding \'g\' in fix spec\n",0x28,1,_stderr);
        }
        fixSpec = fixSpec & 0xf3 | 4;
      }
      else if (cVar2 == 'H') {
        if ((fixSpec & 0x20) != 0) {
          fwrite("warning: \'H\' overriding \'h\' in fix spec\n",0x28,1,_stderr);
        }
        fixSpec = fixSpec & 0xcf | 0x10;
      }
      else if (cVar2 == 'L') {
        if ((char)fixSpec < '\0') {
          fwrite("warning: \'L\' overriding \'l\' in fix spec\n",0x28,1,_stderr);
        }
        fixSpec = fixSpec & 0x3f | 0x40;
      }
      else if (cVar2 == 'g') {
        if ((fixSpec & 4) != 0) {
          fwrite("warning: \'g\' overriding \'G\' in fix spec\n",0x28,1,_stderr);
        }
        fixSpec = fixSpec & 0xf3 | 8;
      }
      else if (cVar2 == 'h') {
        if ((fixSpec & 0x10) != 0) {
          fwrite("warning: \'h\' overriding \'H\' in fix spec\n",0x28,1,_stderr);
        }
        fixSpec = fixSpec & 0xcf | 0x20;
      }
      else if (cVar2 == 'l') {
        if ((fixSpec & 0x40) != 0) {
          fwrite("warning: \'l\' overriding \'L\' in fix spec\n",0x28,1,_stderr);
        }
        fixSpec = fixSpec & 0x3f | 0x80;
      }
      else {
        if (cVar2 == '\0') goto LAB_00101305;
        fprintf(_stderr,"warning: Ignoring \'%c\' in fix spec\n",(ulong)(uint)(int)cVar2);
      }
      musl_optarg = musl_optarg + 1;
    } while( true );
  case 0x69:
    gameID = musl_optarg;
    sStack_e0 = strlen(musl_optarg);
    if (4 < sStack_e0) {
      fprintf(_stderr,"warning: Truncating game ID \"%s\" to 4 chars\n",pcVar9);
      sStack_e0 = 4;
    }
    gameIDLen = (uint8_t)sStack_e0;
    if (0xb < titleLen) {
      titleLen = '\v';
      pcVar9 = "warning: Truncating title \"%s\" to 11 chars\n";
LAB_00101653:
      fprintf(_stderr,pcVar9,title);
    }
    goto LAB_00101305;
  case 0x6a:
    japanese = '\x01';
    goto LAB_00101305;
  case 0x6b:
    newLicensee = musl_optarg;
    sStack_e0 = strlen(musl_optarg);
    if (2 < sStack_e0) {
      fprintf(_stderr,"warning: Truncating new licensee \"%s\" to 2 chars\n",pcVar9);
      sStack_e0 = 2;
    }
    newLicenseeLen = (uint8_t)sStack_e0;
    goto LAB_00101305;
  case 0x6c:
    if (*musl_optarg == '$') {
      pcVar9 = musl_optarg + 1;
      iVar5 = 0x10;
    }
    else {
      if (*musl_optarg == '\0') {
        pcVar9 = "error: Argument to option \'l\' may not be empty\n";
LAB_001016d5:
        report(pcVar9);
        goto LAB_00101305;
      }
      iVar5 = 0;
    }
    pcVar9 = (char *)strtoul(pcVar9,&endptr,iVar5);
    if (*endptr == '\0') {
      if (pcVar9 < (char *)0x100) {
        oldLicensee = (uint16_t)pcVar9;
        goto LAB_00101305;
      }
      pcVar15 = "error: Argument to option \'l\' is larger than 255: %lu\n";
    }
    else {
      pcVar15 = "error: Expected number as argument to option \'l\', got %s\n";
      pcVar9 = musl_optarg;
    }
    break;
  case 0x6d:
    iVar5 = strcasecmp(musl_optarg,"help");
    if (iVar5 == 0) {
      fputs("Accepted MBC names:\n",_stderr);
      printAcceptedMBCNames();
      goto LAB_001023d2;
    }
    bVar11 = *pcVar9;
    if (bVar11 == 0x24 || (byte)(bVar11 - 0x30) < 10) {
      uVar7 = strtoul(pcVar9 + (bVar11 == 0x24),&endptr,(uint)(bVar11 == 0x24) << 4);
      MVar17 = (MbcType)uVar7;
      if (0xff < uVar7) {
        MVar17 = MBC_BAD_RANGE;
      }
      if (*endptr == '\0') goto switchD_00101786_caseD_6e;
      cartridgeType = MBC_BAD;
LAB_00101f9a:
      pcVar9 = "error: Unknown MBC \"%s\"\nAccepted MBC names:\n";
    }
    else {
      pbVar13 = (byte *)(pcVar9 + 2);
      while ((bVar11 == 0x20 || (bVar11 == 9))) {
        pbVar1 = pbVar13 + -1;
        pbVar13 = pbVar13 + 1;
        bVar11 = *pbVar1;
      }
      endptr = (char *)(pbVar13 + -1);
      MVar17 = MBC_BAD;
      switch(bVar11) {
      case 0x4d:
switchD_00101786_caseD_6d:
        bVar11 = pbVar13[-1];
        if (bVar11 != 0x42) {
          if ((bVar11 == 0x4d) || (bVar11 == 0x6d)) {
            endptr = (char *)pbVar13;
            bVar18 = readMBCSlice(&endptr,"M01");
            MVar16 = MMM01;
            goto LAB_00101afc;
          }
          endptr = (char *)pbVar13;
          if (bVar11 != 0x62) break;
        }
        endptr = (char *)pbVar13;
        if ((*pbVar13 | 0x20) == 99) {
          endptr = (char *)(pbVar13 + 2);
          bVar11 = pbVar13[1] - 0x31;
          if ((bVar11 < 7) && ((0x77U >> (bVar11 & 0x1f) & 1) != 0)) {
            MVar16 = (MbcType)*(ushort *)(&DAT_00104250 + (ulong)bVar11 * 2);
            goto LAB_00101be3;
          }
        }
        break;
      case 0x4e:
      case 0x4f:
      case 0x51:
      case 0x53:
        break;
      case 0x50:
switchD_00101786_caseD_70:
        bVar18 = readMBCSlice(&endptr,"OCKET CAMERA");
        MVar16 = POCKET_CAMERA;
LAB_00101afc:
        if (bVar18 != false) {
LAB_00101be3:
          uVar7 = 0;
          while( true ) {
            uVar4 = (uint)uVar7;
            pcVar9 = endptr + 2;
            for (pcVar15 = endptr;
                ((cVar2 = *pcVar15, cVar2 == '\t' || (cVar2 == ' ')) || (cVar2 == '_'));
                pcVar15 = pcVar15 + 1) {
              pcVar9 = pcVar9 + 1;
            }
            bVar11 = (byte)uVar7;
            if (cVar2 == '\0') break;
            endptr = pcVar15 + 1;
            if (cVar2 != '+') goto switchD_00101786_caseD_6e;
            for (; ((cVar2 = pcVar9[-1], cVar2 == '\t' || (cVar2 == '_')) || (cVar2 == ' '));
                pcVar9 = pcVar9 + 1) {
            }
            endptr = pcVar9;
            switch(cVar2) {
            case 'M':
switchD_00101c5c_caseD_6d:
              bVar18 = readMBCSlice(&endptr,"ULTIRUMBLE");
              bVar12 = 4;
              break;
            case 'N':
            case 'O':
            case 'P':
            case 'Q':
              goto switchD_00101786_caseD_6e;
            case 'R':
switchD_00101c5c_caseD_72:
              endptr = pcVar9 + 1;
              cVar2 = *pcVar9;
              if (cVar2 == 'A') {
LAB_00101d63:
                if ((byte)(*endptr | 0x20U) == 0x6d) {
                  endptr = pcVar9 + 2;
                  bVar12 = 0x80;
                  goto LAB_00101d5b;
                }
                goto switchD_00101786_caseD_6e;
              }
              if (cVar2 != 'u') {
                if (cVar2 == 'a') goto LAB_00101d63;
                if (cVar2 != 'U') goto switchD_00101786_caseD_6e;
              }
              bVar18 = readMBCSlice(&endptr,"MBLE");
              bVar12 = 0x10;
              break;
            case 'S':
switchD_00101c5c_caseD_73:
              bVar18 = readMBCSlice(&endptr,"ENSOR");
              bVar12 = 8;
              break;
            case 'T':
switchD_00101c5c_caseD_74:
              bVar18 = readMBCSlice(&endptr,"IMER");
              bVar12 = 0x20;
              break;
            default:
              switch(cVar2) {
              case 'm':
                goto switchD_00101c5c_caseD_6d;
              case 'n':
              case 'o':
              case 'p':
              case 'q':
                goto switchD_00101786_caseD_6e;
              case 'r':
                goto switchD_00101c5c_caseD_72;
              case 's':
                goto switchD_00101c5c_caseD_73;
              case 't':
                goto switchD_00101c5c_caseD_74;
              default:
                if ((cVar2 != 'b') && (cVar2 != 'B')) goto switchD_00101786_caseD_6e;
                bVar18 = readMBCSlice(&endptr,"ATTERY");
                bVar12 = 0x40;
              }
            }
            if (bVar18 == false) goto switchD_00101786_caseD_6e;
LAB_00101d5b:
            uVar7 = (ulong)(bVar11 | bVar12);
          }
          MVar17 = MVar16 & 0xffff;
          if (MVar17 - POCKET_CAMERA < 3) {
LAB_00101e1e:
            MVar17 = MBC_WRONG_FEATURES;
            if (bVar11 == 0) goto LAB_00101f54;
          }
          else if (MVar17 == TPP1) {
            if ((char)bVar11 < '\0') {
              fwrite("warning: TPP1 requests RAM implicitly if given a non-zero RAM size",0x42,1,
                     _stderr);
            }
            MVar17 = MBC_WRONG_FEATURES;
            if ((uVar7 & 8) == 0) {
              MVar16 = bVar11 >> 4 & MBC1 |
                       (uint)((uVar7 & 4) != 0) * 3 |
                       (uint)((byte)(uVar7 >> 3) & 4) | (uVar4 & 0x40) >> 3 | TPP1;
              goto LAB_00101f54;
            }
          }
          else if (MVar17 == MBC1) {
LAB_00101df2:
            if (bVar11 == 0) goto LAB_00101f54;
joined_r0x00101ec6:
            if (uVar4 == 0xc0) {
              MVar16 = MVar16 + MBC1_RAM;
              goto LAB_00101f54;
            }
joined_r0x00101ed3:
            MVar17 = MBC_WRONG_FEATURES;
            if (uVar4 == 0x80) {
              MVar16 = MVar16 + MBC1;
LAB_00101f54:
              for (; (cVar2 = *pcVar15, cVar2 == '\t' || (cVar2 == ' ')); pcVar15 = pcVar15 + 1) {
              }
              if (cVar2 != '\0') goto LAB_00101f6b;
              MVar17 = MVar16 & 0xffff;
            }
          }
          else if (MVar17 == MBC2) {
            if (bVar11 == 0) {
              MVar16 = MBC2;
              goto LAB_00101f54;
            }
            MVar16 = MBC2_BATTERY;
            MVar17 = MBC_WRONG_FEATURES;
            if (uVar4 == 0x40) goto LAB_00101f54;
          }
          else {
            if (MVar17 == MMM01) goto LAB_00101df2;
            if (MVar17 == MBC3) {
              MVar16 = MBC3;
              if ((uVar7 & 0x20) != 0) {
                if ((uVar7 & 0x40) == 0) {
                  fwrite("warning: MBC3+TIMER implies BATTERY\n",0x24,1,_stderr);
                }
                uVar4 = uVar4 & 0xffffff9c;
                MVar16 = MBC3_TIMER_BATTERY;
              }
              if ((char)uVar4 != '\0') goto joined_r0x00101ec6;
              goto LAB_00101f54;
            }
            if (MVar17 == MBC5) {
              MVar16 = (uint)((uVar7 & 0x10) != 0) * 3 + MBC5;
              if ((uVar7 & 0xec) == 0) goto LAB_00101f54;
              uVar4 = (uint)(bVar11 & 0xec);
              if ((bVar11 & 0xec) == 0xc0) {
                MVar16 = MVar16 | MBC1_RAM;
                goto LAB_00101f54;
              }
              goto joined_r0x00101ed3;
            }
            if (MVar17 == MBC6) goto LAB_00101e1e;
            if (MVar17 == MBC7_SENSOR_RUMBLE_RAM_BATTERY) {
              MVar17 = MBC_WRONG_FEATURES;
              MVar16 = MBC7_SENSOR_RUMBLE_RAM_BATTERY;
              if (bVar11 == 0xd8) goto LAB_00101f54;
            }
            else {
              if (MVar17 != HUC1_RAM_BATTERY) {
                if ((MVar16 & 0xffff) == ROM) {
                  MVar16 = MBC2_BATTERY|MBC1;
                  if (bVar11 != 0) goto LAB_00101df2;
                  MVar16 = ROM;
                }
                goto LAB_00101f54;
              }
              MVar17 = MBC_WRONG_FEATURES;
              MVar16 = HUC1_RAM_BATTERY;
              if (bVar11 == 0xc0) goto LAB_00101f54;
            }
          }
        }
        break;
      case 0x52:
switchD_00101786_caseD_72:
        bVar18 = readMBCSlice(&endptr,"OM");
        if (bVar18) {
          for (; ((cVar2 = *endptr, cVar2 == '\t' || (cVar2 == ' ')) || (cVar2 == '_'));
              endptr = endptr + 1) {
          }
          if ((cVar2 == 'O') || (cVar2 == 'o')) {
            endptr = endptr + 1;
            bVar18 = readMBCSlice(&endptr,"NLY");
            if (!bVar18) break;
          }
          MVar16 = ROM;
          goto LAB_00101be3;
        }
        break;
      case 0x54:
switchD_00101786_caseD_74:
        if (pbVar13[-1] != 0x50) {
          endptr = (char *)pbVar13;
          if (pbVar13[-1] != 0x41) break;
          pcVar9 = "MA5";
LAB_00101a45:
          bVar18 = readMBCSlice(&endptr,pcVar9);
          MVar16 = BANDAI_TAMA5;
          goto LAB_00101afc;
        }
        endptr = (char *)pbVar13;
        bVar18 = readMBCSlice(&endptr,"P1");
        pcVar9 = endptr;
        if (!bVar18) break;
        for (; (*pcVar9 == '_' || (*pcVar9 == ' ')); pcVar9 = pcVar9 + 1) {
        }
        uVar7 = strtoul(pcVar9,&local_c8,10);
        pcVar15 = "error: Failed to parse TPP1 major revision number\n";
        if (pcVar9 == local_c8) {
LAB_00101bca:
          report(pcVar15);
        }
        else {
          endptr = local_c8;
          pcVar15 = "error: RGBFIX only supports TPP1 versions 1.0\n";
          if (uVar7 != 1) goto LAB_00101bca;
          tpp1Rev[0] = '\x01';
          bVar18 = readMBCSlice(&endptr,".");
          pcVar9 = endptr;
          if (bVar18) {
            uVar7 = strtoul(endptr,&local_c8,10);
            pcVar15 = "error: Failed to parse TPP1 minor revision number\n";
            if (local_c8 != pcVar9) {
              endptr = local_c8;
              pcVar15 = "error: TPP1 minor revision number must be 8-bit\n";
              if (uVar7 < 0x100) {
                tpp1Rev[1] = (uint8_t)uVar7;
                MVar16 = 0x100100;
                goto LAB_00101be3;
              }
            }
            goto LAB_00101bca;
          }
        }
LAB_00101f6b:
        MVar17 = MBC_BAD;
        break;
      default:
        switch(bVar11) {
        case 0x6d:
          goto switchD_00101786_caseD_6d;
        case 0x6e:
        case 0x6f:
        case 0x71:
        case 0x73:
          break;
        case 0x70:
          goto switchD_00101786_caseD_70;
        case 0x72:
          goto switchD_00101786_caseD_72;
        case 0x74:
          goto switchD_00101786_caseD_74;
        default:
          if (bVar11 == 0x42) {
LAB_00101a39:
            pcVar9 = "ANDAI TAMA5";
            goto LAB_00101a45;
          }
          if (bVar11 != 0x48) {
            if (bVar11 == 0x62) goto LAB_00101a39;
            if (bVar11 != 0x68) break;
          }
          bVar18 = readMBCSlice(&endptr,"UC");
          if (!bVar18) break;
          pcVar9 = endptr + 1;
          cVar2 = *endptr;
          endptr = pcVar9;
          if (cVar2 == '1') {
            MVar16 = HUC1_RAM_BATTERY;
          }
          else {
            if (cVar2 != '3') break;
            MVar16 = HUC3;
          }
          goto LAB_00101be3;
        }
      }
switchD_00101786_caseD_6e:
      cartridgeType = MVar17;
      if (MVar17 == MBC_BAD_RANGE) {
        report("error: Specified MBC ID out of range 0-255: %s\n",musl_optarg);
        goto LAB_00101305;
      }
      if (MVar17 != MBC_WRONG_FEATURES) {
        if (MVar17 == MBC_BAD) goto LAB_00101f9a;
        if ((MVar17 & ~MBC1) == ROM_RAM) {
          fwrite("warning: ROM+RAM / ROM+RAM+BATTERY are under-specified and poorly supported\n",
                 0x4c,1,_stderr);
        }
        goto LAB_00101305;
      }
      pcVar9 = "error: Features incompatible with MBC (\"%s\")\nAccepted combinations:\n";
    }
    report(pcVar9,musl_optarg);
    printAcceptedMBCNames();
    goto LAB_00101305;
  case 0x6e:
    if (*musl_optarg == '$') {
      pcVar9 = musl_optarg + 1;
      iVar5 = 0x10;
    }
    else {
      if (*musl_optarg == '\0') {
        pcVar9 = "error: Argument to option \'n\' may not be empty\n";
        goto LAB_001016d5;
      }
      iVar5 = 0;
    }
    pcVar9 = (char *)strtoul(pcVar9,&endptr,iVar5);
    if (*endptr == '\0') {
      if (pcVar9 < (char *)0x100) {
        romVersion = (uint16_t)pcVar9;
        goto LAB_00101305;
      }
      pcVar15 = "error: Argument to option \'n\' is larger than 255: %lu\n";
    }
    else {
      pcVar15 = "error: Expected number as argument to option \'n\', got %s\n";
      pcVar9 = musl_optarg;
    }
    break;
  case 0x70:
    if (*musl_optarg == '$') {
      pcVar9 = musl_optarg + 1;
      iVar5 = 0x10;
    }
    else {
      if (*musl_optarg == '\0') {
        pcVar9 = "error: Argument to option \'p\' may not be empty\n";
        goto LAB_001016d5;
      }
      iVar5 = 0;
    }
    pcVar9 = (char *)strtoul(pcVar9,&endptr,iVar5);
    if (*endptr == '\0') {
      if (pcVar9 < (char *)0x100) {
        padValue = (uint16_t)pcVar9;
        goto LAB_00101305;
      }
      pcVar15 = "error: Argument to option \'p\' is larger than 255: %lu\n";
    }
    else {
      pcVar15 = "error: Expected number as argument to option \'p\', got %s\n";
      pcVar9 = musl_optarg;
    }
    break;
  case 0x72:
    if (*musl_optarg == '$') {
      pcVar9 = musl_optarg + 1;
      iVar5 = 0x10;
    }
    else {
      if (*musl_optarg == '\0') {
        pcVar9 = "error: Argument to option \'r\' may not be empty\n";
        goto LAB_001016d5;
      }
      iVar5 = 0;
    }
    pcVar9 = (char *)strtoul(pcVar9,&endptr,iVar5);
    if (*endptr == '\0') {
      if (pcVar9 < (char *)0x100) {
        ramSize = (uint16_t)pcVar9;
        goto LAB_00101305;
      }
      pcVar15 = "error: Argument to option \'r\' is larger than 255: %lu\n";
    }
    else {
      pcVar15 = "error: Expected number as argument to option \'r\', got %s\n";
      pcVar9 = musl_optarg;
    }
    break;
  case 0x73:
    sgb = '\x01';
    goto LAB_00101305;
  case 0x74:
    title = musl_optarg;
    sVar8 = strlen(musl_optarg);
    bVar11 = (model == DMG) + 0xf;
    if (gameID != (char *)0x0) {
      bVar11 = 0xb;
    }
    uVar7 = (ulong)bVar11;
    if (uVar7 < sVar8) {
      fprintf(_stderr,"warning: Truncating title \"%s\" to %u chars\n",pcVar9,uVar7);
      sVar8 = uVar7;
    }
    titleLen = (uint8_t)sVar8;
    goto LAB_00101305;
  case 0x76:
    fixSpec = 0xa8;
    goto LAB_00101305;
  default:
    if (uVar4 == 0x43) goto switchD_0010132f_caseD_63;
    if (uVar4 == 0x4f) goto code_r0x001014dd;
    if (uVar4 != 0xffffffff) goto switchD_0010132f_caseD_57;
    if (((cartridgeType >> 8 & 0xff) == 1) && (japanese == '\x01')) {
      fwrite("warning: TPP1 overwrites region flag for its identification code, ignoring `-j`\n",
             0x50,1,_stderr);
    }
    __stream = _stderr;
    if ((ramSize != 0x200) && ((cartridgeType & 0xff00) == ROM)) {
      if ((cartridgeType & 0xffff00fe) == ROM_RAM) {
        if (ramSize != 1) {
          pcVar9 = mbcName(cartridgeType);
          pcVar15 = "warning: MBC \"%s\" should have 2 KiB of RAM (-r 1)\n";
LAB_001021a8:
          fprintf(__stream,pcVar15,pcVar9);
        }
      }
      else {
        if (cartridgeType < (MBC7_SENSOR_RUMBLE_RAM_BATTERY|MBC1)) {
          if ((0x46c0d330cU >> ((ulong)cartridgeType & 0x3f) & 1) != 0) {
LAB_001020f8:
            if (ramSize == 1) {
              pcVar9 = mbcName(cartridgeType);
              pcVar15 = "warning: RAM size 1 (2 KiB) was specified for MBC \"%s\"\n";
            }
            else {
              if (ramSize != 0) goto LAB_001021b5;
              pcVar9 = mbcName(cartridgeType);
              pcVar15 = "warning: MBC \"%s\" has RAM, but RAM size was set to 0\n";
            }
            goto LAB_001021a8;
          }
          if ((0x112028863U >> ((ulong)cartridgeType & 0x3f) & 1) == 0) goto LAB_00102149;
        }
        else {
LAB_00102149:
          if (3 < cartridgeType - MBC_NONE) {
            if ((cartridgeType - HUC3 < 2) || (cartridgeType == POCKET_CAMERA)) goto LAB_001020f8;
            if (cartridgeType != BANDAI_TAMA5) {
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
          }
        }
        if (ramSize != 0) {
          pcVar9 = mbcName(cartridgeType);
          fprintf(__stream,"warning: MBC \"%s\" has no RAM, but RAM size was set to %u\n",pcVar9);
        }
      }
    }
LAB_001021b5:
    if (((sgb == '\x01') && (oldLicensee != 0x33)) && (oldLicensee != 0x200)) {
      fprintf(_stderr,"warning: SGB compatibility enabled, but old licensee is 0x%02x, not 0x33\n");
    }
    pcVar9 = argv[musl_optind];
    if (pcVar9 == (char *)0x0) {
      fputs("FATAL: Please specify an input file (pass `-` to read from standard input)\n",_stderr);
LAB_00102398:
      printUsage();
      exit(1);
    }
    bVar18 = nbErrors != '\0';
    ppcVar14 = argv + (long)musl_optind + 1;
    goto LAB_00102207;
  }
  report(pcVar15,pcVar9);
  goto LAB_00101305;
code_r0x001014dd:
  overwriteRom = 1;
  goto LAB_00101305;
LAB_00102207:
  nbErrors = '\0';
  if ((*pcVar9 == '-') && (pcVar9[1] == '\0')) {
    pcVar9 = "<stdin>";
    processFile(0,1,"<stdin>",0);
  }
  else {
    iVar5 = open(pcVar9,2);
    if (iVar5 == -1) {
      piVar10 = __errno_location();
      pcVar15 = strerror(*piVar10);
      report("FATAL: Failed to open \"%s\" for reading+writing: %s\n",pcVar9,pcVar15);
    }
    else {
      iVar6 = fstat(iVar5,(stat *)&endptr);
      if (iVar6 == -1) {
        piVar10 = __errno_location();
        pcVar15 = strerror(*piVar10);
        fmt = "FATAL: Failed to stat \"%s\": %s\n";
LAB_001022ab:
        report(fmt,pcVar9,pcVar15);
      }
      else if ((local_a8 & 0xf000) == 0x8000) {
        if ((long)local_90 < 0x150) {
          fmt = "FATAL: \"%s\" too short, expected at least 336 ($150) bytes, got only %jd\n";
          pcVar15 = local_90;
          goto LAB_001022ab;
        }
        processFile(iVar5,iVar5,pcVar9,(off_t)local_90);
      }
      else {
        report("FATAL: \"%s\" is not a regular file, and thus cannot be modified in-place\n",pcVar9)
        ;
      }
      close(iVar5);
    }
  }
  uVar4 = (uint)nbErrors;
  if (uVar4 == 0) {
    bVar19 = false;
  }
  else {
    pcVar15 = "s";
    if (uVar4 == 1) {
      pcVar15 = "";
    }
    fprintf(_stderr,"Fixing \"%s\" failed with %u error%s\n",pcVar9,(ulong)uVar4,pcVar15);
    bVar19 = nbErrors != '\0';
  }
  bVar18 = (bool)(bVar18 | bVar19);
  pcVar9 = *ppcVar14;
  ppcVar14 = ppcVar14 + 1;
  if (pcVar9 == (char *)0x0) {
    return (uint)bVar18;
  }
  goto LAB_00102207;
}

Assistant:

int main(int argc, char *argv[])
{
	nbErrors = 0;

	for (int ch; (ch = musl_getopt_long_only(argc, argv, optstring, longopts, NULL)) != -1;) {
		switch (ch) {
			size_t len;
#define parseByte(output, name) \
do { \
	char *endptr; \
	unsigned long tmp; \
	\
	if (musl_optarg[0] == 0) { \
		report("error: Argument to option '" name "' may not be empty\n"); \
	} else { \
		if (musl_optarg[0] == '$') { \
			tmp = strtoul(&musl_optarg[1], &endptr, 16); \
		} else { \
			tmp = strtoul(musl_optarg, &endptr, 0); \
		} \
		if (*endptr) \
			report("error: Expected number as argument to option '" name "', got %s\n", \
			       musl_optarg); \
		else if (tmp > 0xFF) \
			report("error: Argument to option '" name "' is larger than 255: %lu\n", tmp); \
		else \
			output = tmp; \
	} \
} while (0)

		case 'C':
		case 'c':
			model = ch == 'c' ? BOTH : CGB;
			if (titleLen > 15) {
				titleLen = 15;
				fprintf(stderr, "warning: Truncating title \"%s\" to 15 chars\n",
					title);
			}
			break;

		case 'f':
			fixSpec = 0;
			while (*musl_optarg) {
				switch (*musl_optarg) {
#define SPEC_l FIX_LOGO
#define SPEC_L TRASH_LOGO
#define SPEC_h FIX_HEADER_SUM
#define SPEC_H TRASH_HEADER_SUM
#define SPEC_g FIX_GLOBAL_SUM
#define SPEC_G TRASH_GLOBAL_SUM
#define overrideSpec(cur, bad) \
do { \
	if (fixSpec & SPEC_##bad) \
		fprintf(stderr, \
			"warning: '" #cur "' overriding '" #bad "' in fix spec\n"); \
	fixSpec = (fixSpec & ~SPEC_##bad) | SPEC_##cur; \
} while (0)
				case 'l':
					overrideSpec(l, L);
					break;
				case 'L':
					overrideSpec(L, l);
					break;

				case 'h':
					overrideSpec(h, H);
					break;
				case 'H':
					overrideSpec(H, h);
					break;

				case 'g':
					overrideSpec(g, G);
					break;
				case 'G':
					overrideSpec(G, g);
					break;

				default:
					fprintf(stderr, "warning: Ignoring '%c' in fix spec\n",
						*musl_optarg);
#undef overrideSpec
				}
				musl_optarg++;
			}
			break;

		case 'i':
			gameID = musl_optarg;
			len = strlen(gameID);
			if (len > 4) {
				len = 4;
				fprintf(stderr, "warning: Truncating game ID \"%s\" to 4 chars\n",
					gameID);
			}
			gameIDLen = len;
			if (titleLen > 11) {
				titleLen = 11;
				fprintf(stderr, "warning: Truncating title \"%s\" to 11 chars\n",
					title);
			}
			break;

		case 'j':
			japanese = false;
			break;

		case 'k':
			newLicensee = musl_optarg;
			len = strlen(newLicensee);
			if (len > 2) {
				len = 2;
				fprintf(stderr,
					"warning: Truncating new licensee \"%s\" to 2 chars\n",
					newLicensee);
			}
			newLicenseeLen = len;
			break;

		case 'l':
			parseByte(oldLicensee, "l");
			break;

		case 'm':
			cartridgeType = parseMBC(musl_optarg);
			if (cartridgeType == MBC_BAD) {
				report("error: Unknown MBC \"%s\"\nAccepted MBC names:\n",
				       musl_optarg);
				printAcceptedMBCNames();
			} else if (cartridgeType == MBC_WRONG_FEATURES) {
				report("error: Features incompatible with MBC (\"%s\")\nAccepted combinations:\n",
				       musl_optarg);
				printAcceptedMBCNames();
			} else if (cartridgeType == MBC_BAD_RANGE) {
				report("error: Specified MBC ID out of range 0-255: %s\n",
				       musl_optarg);
			} else if (cartridgeType == ROM_RAM || cartridgeType == ROM_RAM_BATTERY) {
				fprintf(stderr, "warning: ROM+RAM / ROM+RAM+BATTERY are under-specified and poorly supported\n");
			}
			break;

		case 'n':
			parseByte(romVersion, "n");
			break;

		case 'O':
			overwriteRom = true;
			break;

		case 'p':
			parseByte(padValue, "p");
			break;

		case 'r':
			parseByte(ramSize, "r");
			break;

		case 's':
			sgb = true;
			break;

		case 't': {
			title = musl_optarg;
			len = strlen(title);
			uint8_t maxLen = maxTitleLen();

			if (len > maxLen) {
				len = maxLen;
				fprintf(stderr, "warning: Truncating title \"%s\" to %u chars\n",
					title, maxLen);
			}
			titleLen = len;
			break;
		}

		case 'V':
			printf("rgbfix %s\n", get_package_version_string());
			exit(0);

		case 'v':
			fixSpec = FIX_LOGO | FIX_HEADER_SUM | FIX_GLOBAL_SUM;
			break;

		default:
			fprintf(stderr, "FATAL: unknown option '%c'\n", ch);
			printUsage();
			exit(1);
		}
#undef parseByte
	}

	if ((cartridgeType & 0xFF00) == TPP1 && !japanese)
		fprintf(stderr, "warning: TPP1 overwrites region flag for its identification code, ignoring `-j`\n");

	// Check that RAM size is correct for "standard" mappers
	if (ramSize != UNSPECIFIED && (cartridgeType & 0xFF00) == 0) {
		if (cartridgeType == ROM_RAM || cartridgeType == ROM_RAM_BATTERY) {
			if (ramSize != 1)
				fprintf(stderr, "warning: MBC \"%s\" should have 2 KiB of RAM (-r 1)\n",
					mbcName(cartridgeType));
		} else if (hasRAM(cartridgeType)) {
			if (!ramSize) {
				fprintf(stderr,
					"warning: MBC \"%s\" has RAM, but RAM size was set to 0\n",
					mbcName(cartridgeType));
			} else if (ramSize == 1) {
				fprintf(stderr,
					"warning: RAM size 1 (2 KiB) was specified for MBC \"%s\"\n",
					mbcName(cartridgeType));
			} // TODO: check possible values?
		} else if (ramSize) {
			fprintf(stderr,
				"warning: MBC \"%s\" has no RAM, but RAM size was set to %u\n",
				mbcName(cartridgeType), ramSize);
		}
	}

	if (sgb && oldLicensee != UNSPECIFIED && oldLicensee != 0x33)
		fprintf(stderr,
			"warning: SGB compatibility enabled, but old licensee is 0x%02x, not 0x33\n",
			oldLicensee);

	argv += musl_optind;
	bool failed = nbErrors;

	if (!*argv) {
		fputs("FATAL: Please specify an input file (pass `-` to read from standard input)\n",
		      stderr);
		printUsage();
		exit(1);
	}

	do {
		failed |= processFilename(*argv);
	} while (*++argv);

	return failed;
}